

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int XMLNode_get_children_count(XMLNode *node)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = -1;
  if ((node != (XMLNode *)0x0) && (node->init_value == 0x19770522)) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)node->n_children;
    if (node->n_children < 1) {
      uVar2 = uVar3;
    }
    iVar1 = 0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = (iVar1 + 1) - (uint)(node->children[uVar3]->active == 0);
    }
  }
  return iVar1;
}

Assistant:

int XMLNode_get_children_count(const XMLNode* node)
{
	int i, n;

	CHECK_NODE(node, -1);

	for (i = n = 0; i < node->n_children; i++)
		if (node->children[i]->active)
			n++;
	
	return n;
}